

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab5.c
# Opt level: O3

int FeedCompressBig1(void)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uchar *__s;
  
  InputLength = 0;
  if (AlphabetSize != 0) {
    uVar5 = 1;
    uVar3 = 0;
    do {
      sVar1 = InputLength;
      uVar2 = CalcFib(uVar3);
      if (0x2000000 < uVar2 + sVar1) {
        printf("Tester error: generated input is too large");
        return -1;
      }
      __s = Input + InputLength;
      uVar2 = CalcFib(uVar3);
      memset(__s,uVar5 - 1 & 0xff,(ulong)uVar2);
      uVar3 = CalcFib(uVar3);
      InputLength = uVar3 + InputLength;
      uVar3 = uVar5 & 0xff;
      uVar5 = uVar3 + 1;
    } while (uVar3 < AlphabetSize);
  }
  iVar4 = FeedCompress();
  return iVar4;
}

Assistant:

static int FeedCompressBig1(void) {
    InputLength = 0;
    for (unsigned char c = 0; c < AlphabetSize; ++c) {
        if (IsInputTooLarge(InputLength + CalcFib(c))) {
            return -1;
        }
        memset(Input + InputLength, c, CalcFib(c));
        InputLength += CalcFib(c);
    }
    return FeedCompress();
}